

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_normalize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  int iVar1;
  undefined1 local_38 [8];
  mbedtls_mpi T;
  int ret;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = mbedtls_mpi_cmp_int(&pt->Z,0);
  if (iVar1 == 0) {
    grp_local._4_4_ = 0;
  }
  else {
    T._12_4_ = 0xffffff92;
    mbedtls_mpi_init((mbedtls_mpi *)local_38);
    T._12_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)local_38,&pt->Z,&grp->P);
    if ((T._12_4_ == 0) &&
       (T._12_4_ = mbedtls_mpi_mul_mod(grp,&pt->Y,&pt->Y,(mbedtls_mpi *)local_38), T._12_4_ == 0)) {
      T._12_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_38,(mbedtls_mpi *)local_38,
                                     (mbedtls_mpi *)local_38);
      if ((T._12_4_ == 0) &&
         ((T._12_4_ = mbedtls_mpi_mul_mod(grp,&pt->X,&pt->X,(mbedtls_mpi *)local_38), T._12_4_ == 0
          && (T._12_4_ = mbedtls_mpi_mul_mod(grp,&pt->Y,&pt->Y,(mbedtls_mpi *)local_38),
             T._12_4_ == 0)))) {
        T._12_4_ = mbedtls_mpi_lset(&pt->Z,1);
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)local_38);
    grp_local._4_4_ = T._12_4_;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_normalize_jac(const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt)
{
    if (MPI_ECP_CMP_INT(&pt->Z, 0) == 0) {
        return 0;
    }

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_normalize_jac(grp, pt);
    }
#endif /* MBEDTLS_ECP_NORMALIZE_JAC_ALT */

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi T;
    mbedtls_mpi_init(&T);

    MPI_ECP_INV(&T,       &pt->Z);            /* T   <-          1 / Z   */
    MPI_ECP_MUL(&pt->Y,   &pt->Y,     &T);    /* Y'  <- Y*T    = Y / Z   */
    MPI_ECP_SQR(&T,       &T);                /* T   <- T^2    = 1 / Z^2 */
    MPI_ECP_MUL(&pt->X,   &pt->X,     &T);    /* X   <- X  * T = X / Z^2 */
    MPI_ECP_MUL(&pt->Y,   &pt->Y,     &T);    /* Y'' <- Y' * T = Y / Z^3 */

    MPI_ECP_LSET(&pt->Z, 1);

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT) */
}